

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMAddress.cpp
# Opt level: O2

void __thiscall HiROMAddress::fromImageAddress(HiROMAddress *this,ImageAddress *imageAdress)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = imageAdress->t;
  if (uVar1 < 0x400000) {
    uVar2 = (uVar1 & 0x3f0000) + 0x800000;
    if (uVar1 < 0x3e0000) {
      uVar2 = uVar1 & 0x3f0000;
    }
    (this->super_ROMAddress).m_Address = uVar2 | uVar1 % 0xffff;
    return;
  }
  __assert_fail("imageAdress < 0x400000",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SuperMotte[P]65816Disassembler/snesdisasm/ROMAddress.cpp"
                ,0xa4,"virtual void HiROMAddress::fromImageAddress(ImageAddress)");
}

Assistant:

void HiROMAddress::fromImageAddress(ImageAddress imageAdress) {
    assert(imageAdress < 0x400000);

    uint8_t bank = imageAdress / 0x10000;
    uint16_t bankAddress = imageAdress % 0xFFFF;
    if(imageAdress > 0x3DFFFF) {
        //we have to use the second mirror because otherwise we would refer to system RAM
        bank += 0x80;
    }
    m_Address = (bank << 16) | bankAddress;
}